

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O2

int64_t av1_model_rd_for_sb_uv
                  (AV1_COMP *cpi,BLOCK_SIZE plane_bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                  RD_STATS *this_rdc,int start_plane,int stop_plane)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  short *psVar4;
  RD_STATS *pRVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  undefined7 in_register_00000031;
  long lVar10;
  long lVar11;
  int rate;
  int64_t dist;
  uint sse;
  int local_84;
  RD_STATS *local_80;
  long local_78;
  uint local_6c;
  long local_68;
  ulong local_60;
  AV1_COMP *local_58;
  MACROBLOCK *local_50;
  long local_48;
  int *local_40;
  long local_38;
  
  this_rdc->rate = 0;
  this_rdc->dist = 0;
  local_48 = (long)stop_plane;
  this_rdc->skip_txfm = '\0';
  local_60 = CONCAT71(in_register_00000031,plane_bsize) & 0xffffffff;
  lVar10 = (long)start_plane;
  lVar9 = lVar10 * 0x88 + 0x30;
  local_40 = &xd->plane[lVar10].dst.stride;
  lVar7 = 0;
  local_68 = local_60 * 0x70;
  iVar8 = 0;
  lVar11 = 0;
  local_80 = this_rdc;
  local_58 = cpi;
  local_50 = x;
  for (; lVar10 <= local_48; lVar10 = lVar10 + 1) {
    if (x->color_sensitivity_sb_alt[lVar10 + 1] != '\0') {
      psVar4 = *(short **)((long)&x->plane[0].quant_fp_QTX + lVar9);
      sVar2 = psVar4[1];
      sVar3 = *psVar4;
      uVar6 = (**(code **)((long)&local_58->ppi->fn_ptr[0].vf + local_68))
                        (*(undefined8 *)((long)&x->plane[0].src_diff + lVar9),
                         *(undefined4 *)((long)&x->plane[0].coeff + lVar9),
                         ((buf_2d *)(local_40 + -6))->buf,*local_40,&local_6c);
      local_38 = lVar11 + (ulong)local_6c;
      bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_60];
      av1_model_rd_from_var_lapndz
                ((ulong)(local_6c - uVar6),(uint)bVar1,(uint)(int)sVar3 >> 3,&local_84,&local_78);
      lVar11 = local_38;
      pRVar5 = local_80;
      local_80->rate = local_80->rate + (local_84 >> 1);
      local_80->dist = local_80->dist + local_78 * 8;
      av1_model_rd_from_var_lapndz
                ((ulong)uVar6,(uint)bVar1,(uint)(int)sVar2 >> 3,&local_84,&local_78);
      iVar8 = pRVar5->rate + local_84;
      pRVar5->rate = iVar8;
      lVar7 = local_78 * 0x10 + pRVar5->dist;
      pRVar5->dist = lVar7;
      x = local_50;
    }
    lVar9 = lVar9 + 0x88;
    local_40 = local_40 + 0x28c;
  }
  if (iVar8 == 0) {
    local_80->skip_txfm = '\x01';
  }
  if (lVar11 * 0x800 <= lVar7 * 0x80 + ((long)x->rdmult * (long)iVar8 + 0x100 >> 9)) {
    local_80->rate = 0;
    local_80->dist = lVar11 << 4;
    local_80->skip_txfm = '\x01';
  }
  return lVar11;
}

Assistant:

int64_t av1_model_rd_for_sb_uv(AV1_COMP *cpi, BLOCK_SIZE plane_bsize,
                               MACROBLOCK *x, MACROBLOCKD *xd,
                               RD_STATS *this_rdc, int start_plane,
                               int stop_plane) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  int rate;
  int64_t dist;
  int plane;
  int64_t tot_sse = 0;

  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = 0;

  for (plane = start_plane; plane <= stop_plane; ++plane) {
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const uint32_t dc_quant = p->dequant_QTX[0];
    const uint32_t ac_quant = p->dequant_QTX[1];
    const BLOCK_SIZE bs = plane_bsize;
    unsigned int var;
    if (!x->color_sensitivity[COLOR_SENS_IDX(plane)]) continue;

    var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                                  pd->dst.stride, &sse);
    assert(sse >= var);
    tot_sse += sse;

    av1_model_rd_from_var_lapndz(sse - var, num_pels_log2_lookup[bs],
                                 dc_quant >> 3, &rate, &dist);

    this_rdc->rate += rate >> 1;
    this_rdc->dist += dist << 3;

    av1_model_rd_from_var_lapndz(var, num_pels_log2_lookup[bs], ac_quant >> 3,
                                 &rate, &dist);

    this_rdc->rate += rate;
    this_rdc->dist += dist << 4;
  }

  if (this_rdc->rate == 0) {
    this_rdc->skip_txfm = 1;
  }

  if (RDCOST(x->rdmult, this_rdc->rate, this_rdc->dist) >=
      RDCOST(x->rdmult, 0, tot_sse << 4)) {
    this_rdc->rate = 0;
    this_rdc->dist = tot_sse << 4;
    this_rdc->skip_txfm = 1;
  }

  return tot_sse;
}